

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

char * bc_strdup_vprintf(char *format,__va_list_tag *ap)

{
  int iVar1;
  char *__s;
  va_list ap2;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  if (format != (char *)0x0) {
    local_28 = ap->reg_save_area;
    local_38._0_4_ = ap->gp_offset;
    local_38._4_4_ = ap->fp_offset;
    pvStack_30 = ap->overflow_arg_area;
    iVar1 = vsnprintf((char *)0x0,0,format,&local_38);
    if (iVar1 < 0) {
      return (char *)0x0;
    }
    __s = (char *)malloc((ulong)(iVar1 + 1));
    if (__s != (char *)0x0) {
      iVar1 = vsnprintf(__s,(ulong)(iVar1 + 1),format,ap);
      if (-1 < iVar1) {
        return __s;
      }
      free(__s);
    }
  }
  return (char *)0x0;
}

Assistant:

char*
bc_strdup_vprintf(const char *format, va_list ap)
{
    if (format == NULL)
        return NULL;
    va_list ap2;
    va_copy(ap2, ap);
    int l = vsnprintf(NULL, 0, format, ap2);
    va_end(ap2);
    if (l < 0)
        return NULL;
    char *tmp = malloc(l + 1);
    if (!tmp)
        return NULL;
    int l2 = vsnprintf(tmp, l + 1, format, ap);
    if (l2 < 0) {
        free(tmp);
        return NULL;
    }
    return tmp;
}